

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

void free_function(pFunction func)

{
  if (func->type - FT_USER < 2) {
    free_user_function((func->field_3).user);
  }
  else if (func->type != FT_BUILTIN) {
    puts("free_function: unknown function type. Unable to free");
  }
  context_unlink(func->context);
  free(func);
  return;
}

Assistant:

void free_function(pFunction func)
{
    switch (func->type)
    {
        case FT_BUILTIN:
            break;
        case FT_USER_MACRO:
        case FT_USER:
            free_user_function(func->user);
            break;
        default:
            log("free_function: unknown function type. Unable to free");
            break;
    }
    context_unlink(func->context);
    free(func);
}